

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvalidator.h
# Opt level: O0

QValidatorPrivate * __thiscall QValidator::d_func(QValidator *this)

{
  QValidatorPrivate *pQVar1;
  
  pQVar1 = (QValidatorPrivate *)
           qGetPtrHelper<QScopedPointer<QObjectData,QScopedPointerDeleter<QObjectData>>const>
                     ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)0x8ca276);
  return pQVar1;
}

Assistant:

class Q_GUI_EXPORT QIntValidator : public QValidator
{
    Q_OBJECT
    Q_PROPERTY(int bottom READ bottom WRITE setBottom NOTIFY bottomChanged)
    Q_PROPERTY(int top READ top WRITE setTop NOTIFY topChanged)

public:
    explicit QIntValidator(QObject * parent = nullptr);
    QIntValidator(int bottom, int top, QObject *parent = nullptr);
    ~QIntValidator();

    QValidator::State validate(QString &, int &) const override;
    void fixup(QString &input) const override;

    void setBottom(int);
    void setTop(int);
    void setRange(int bottom, int top);

    int bottom() const { return b; }
    int top() const { return t; }
Q_SIGNALS:
    void bottomChanged(int bottom);
    void topChanged(int top);

private:
    Q_DISABLE_COPY(QIntValidator)

    int b;
    int t;
}